

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O1

ImageChannelValues * __thiscall
pbrt::Image::Bilerp(ImageChannelValues *__return_storage_ptr__,Image *this,Point2f p,
                   ImageChannelDesc *desc,WrapMode2D wrapMode)

{
  size_t count;
  anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
  *paVar1;
  anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
  *paVar2;
  ulong uVar3;
  Float FVar4;
  float local_4c;
  Tuple2<pbrt::Point2,_float> local_48;
  polymorphic_allocator<float> local_38;
  
  count = (desc->offset).nStored;
  local_4c = 0.0;
  local_48 = p.super_Tuple2<pbrt::Point2,_float>;
  local_38.memoryResource = pstd::pmr::new_delete_resource();
  InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::InlinedVector
            (&__return_storage_ptr__->
              super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>,count,
             &local_4c,&local_38);
  if ((desc->offset).nStored != 0) {
    uVar3 = 0;
    do {
      paVar1 = (anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
                *)(desc->offset).ptr;
      if (paVar1 == (anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
                     *)0x0) {
        paVar1 = &(desc->offset).field_2;
      }
      FVar4 = BilerpChannel(this,(Point2f)local_48,paVar1->fixed[uVar3],wrapMode);
      paVar2 = (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
                *)(__return_storage_ptr__->
                  super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>).ptr;
      if (paVar2 == (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
                     *)0x0) {
        paVar2 = &(__return_storage_ptr__->
                  super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>).field_2;
      }
      paVar2->fixed[uVar3] = FVar4;
      uVar3 = uVar3 + 1;
    } while (uVar3 < (desc->offset).nStored);
  }
  return __return_storage_ptr__;
}

Assistant:

ImageChannelValues Image::Bilerp(Point2f p, const ImageChannelDesc &desc,
                                 WrapMode2D wrapMode) const {
    ImageChannelValues cv(desc.offset.size(), Float(0));
    for (int i = 0; i < desc.offset.size(); ++i)
        cv[i] = BilerpChannel(p, desc.offset[i], wrapMode);
    return cv;
}